

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

FState * __thiscall AActor::GetRaiseState(AActor *this)

{
  bool bVar1;
  FState *pFVar2;
  FName local_c;
  
  if (((this->flags).Value & 0x100000) == 0) {
    return (FState *)0x0;
  }
  if (((this->tics == -1) || ((this->state->StateFlags & 0x20) != 0)) &&
     (bVar1 = DObject::IsKindOf((DObject *)this,APlayerPawn::RegistrationInfo.MyClass), !bVar1)) {
    local_c.Index = 0x8d;
    pFVar2 = FindState(this,&local_c);
    return pFVar2;
  }
  return (FState *)0x0;
}

Assistant:

FState *AActor::GetRaiseState()
{
	if (!(flags & MF_CORPSE))
	{
		return NULL;	// not a monster
	}

	if (tics != -1 && // not lying still yet
		!state->GetCanRaise()) // or not ready to be raised yet
	{
		return NULL;
	}

	if (IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{
		return NULL;	// do not resurrect players
	}

	return FindState(NAME_Raise);
}